

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

quad_value_bit_vector *
bsim::lshr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a,
          quad_value_bit_vector *shift_amount)

{
  bool bVar1;
  bv_uint64 bVar2;
  long lVar3;
  long lVar4;
  int ind;
  quad_value_bit_vector *other;
  quad_value_bit_vector res;
  quad_value_bit_vector local_48;
  
  bVar1 = quad_value_bit_vector::is_binary(a);
  if ((bVar1) && (bVar1 = quad_value_bit_vector::is_binary(shift_amount), bVar1)) {
    quad_value_bit_vector::quad_value_bit_vector(&local_48,a->N);
    bVar2 = get_shift_int(shift_amount);
    other = a;
    if (bVar2 != 0) {
      lVar4 = (ulong)(~(uint)bVar2 + a->N) << 0x20;
      for (lVar3 = (long)a->N; (long)bVar2 < lVar3; lVar3 = lVar3 + -1) {
        local_48.bits.super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar4 >> 0x20].value =
             (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar3 + -1].value;
        lVar4 = lVar4 + -0x100000000;
      }
      ind = a->N;
      while (other = &local_48, (int)(a->N - (uint)bVar2) < ind) {
        ind = ind + -1;
        quad_value_bit_vector::set(&local_48,ind,0);
      }
    }
    quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,other);
    std::_Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>::~_Vector_base
              ((_Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_> *)&local_48);
  }
  else {
    unknown_bv(__return_storage_ptr__,a->N);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  lshr(const quad_value_bit_vector& a,
       const quad_value_bit_vector& shift_amount) {

    if (!a.is_binary() || !shift_amount.is_binary()) {
      return unknown_bv(a.bitLength());
    }
    
    quad_value_bit_vector res(a.bitLength());

    bv_uint64 shift_int = get_shift_int(shift_amount);

    if (shift_int == 0) {
      return a;
    }

    //unsigned char sign_bit = a.get(a.bitLength() - 1);
    for (int i = a.bitLength() - 1; i >= (int) shift_int; i--) {
      res.set(i - shift_int, a.get(i));
    }

    for (int i = a.bitLength() - 1; i >= (((int) a.bitLength()) - ((int) shift_int)); i--) {
      res.set(i, 0);
    }

    return res;
  }